

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::RgbaInputFile::readPixels(RgbaInputFile *this,int scanLine1,int scanLine2)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  
  __mutex = (pthread_mutex_t *)this->_fromYca;
  if (__mutex == (pthread_mutex_t *)0x0) {
    InputFile::readPixels(this->_inputFile,scanLine1,scanLine2);
    return;
  }
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    FromYca::readPixels(this->_fromYca,scanLine1,scanLine2);
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void	
RgbaInputFile::readPixels (int scanLine1, int scanLine2)
{
    if (_fromYca)
    {
	Lock lock (*_fromYca);
	_fromYca->readPixels (scanLine1, scanLine2);
    }
    else
    {
	_inputFile->readPixels (scanLine1, scanLine2);
    }
}